

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Robot.cpp
# Opt level: O2

void __thiscall Robot::calcWorldVelocity(Robot *this)

{
  pointer pdVar1;
  pointer pdVar2;
  int i;
  long lVar3;
  int j;
  long lVar4;
  double dVar5;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  b;
  vector<double,_std::allocator<double>_> ans;
  
  std::vector<double,_std::allocator<double>_>::vector(&ans,3,(allocator_type *)&b);
  bMatrix(&b,(this->robotInfo).theta);
  pdVar1 = (this->robotInfo).selfCorVelocity.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    ans.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [lVar3] = 0.0;
    pdVar2 = b.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar3].
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    dVar5 = 0.0;
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      dVar5 = dVar5 + pdVar2[lVar4] * pdVar1[lVar4];
      ans.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar3] = dVar5;
    }
  }
  std::vector<double,_std::allocator<double>_>::operator=(&(this->robotInfo).robotVelocity,&ans);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&b);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&ans.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void Robot::calcWorldVelocity() {
    std::vector<double> ans(3);
    std::vector<std::vector<double> > b = bMatrix(this->robotInfo.theta);
    for (int i = 0; i < 3; i++) {
        ans[i] = 0;
        for (int j = 0; j < 3; j++) {
            ans[i] += b[i][j] * this->robotInfo.selfCorVelocity[j];
        }
    }
    this->robotInfo.robotVelocity = ans;
}